

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

optional<unsigned_long_long> __thiscall QMetaEnum::keysToValue64(QMetaEnum *this,char *keys)

{
  int iVar1;
  storage_type *psVar2;
  bool bVar3;
  EnumExtendMode modes;
  qsizetype qVar4;
  QByteArrayView *pQVar5;
  unsigned_long_long *puVar6;
  uint index;
  QByteArrayView *this_00;
  ulong uVar7;
  R_conflict6 *pRVar8;
  _Storage<unsigned_long_long,_true> unaff_R14;
  _Storage<unsigned_long_long,_true> __return_storage_ptr__;
  QByteArrayView *pQVar9;
  long in_FS_OFFSET;
  optional<unsigned_long_long> oVar10;
  QByteArrayView qualifiedKey;
  _Storage<unsigned_long_long,_true> local_178;
  QByteArrayView local_160;
  char *keys_local;
  QByteArrayView local_148;
  QByteArrayView local_138;
  undefined1 *local_128;
  undefined1 *puStack_120;
  R_conflict6 parsed;
  undefined1 local_f0 [184];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = 0;
  keys_local = keys;
  if ((keys == (char *)0x0) ||
     (parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
      super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size =
           CONCAT44(parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
                    super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size._4_4_,
                    parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
                    super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size._0_4_),
     this->mobj == (QMetaObject *)0x0)) goto LAB_00262f13;
  modes = enumExtendMode(this);
  memset((QByteArrayView *)(local_f0 + 0x18),0xaa,0xa0);
  local_f0._0_8_ = 10;
  local_f0._8_8_ = 0;
  local_f0._16_8_ = (QByteArrayView *)(local_f0 + 0x18);
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_160,&keys_local);
  __return_storage_ptr__._M_value = (unsigned_long_long)&local_138;
  local_138 = QByteArrayView::trimmed((QByteArrayView *)__return_storage_ptr__);
  if (local_138.m_size == 0) {
    parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size._0_4_ = 2;
    parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._20_4_ = 0;
    parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size._4_4_ = 0;
    parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_payload._8_4_ = 0;
    parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_payload._12_4_ = 0;
    parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_engaged = false;
    parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._17_3_ = 0;
    parsed.key.m_size = (qsizetype)anon_var_dwarf_1ca02;
    QMessageLogger::warning((QMessageLogger *)&parsed,"QMetaEnum::keysToValue: empty keys string.");
LAB_00262f04:
    uVar7 = 0;
    local_178 = __return_storage_ptr__;
  }
  else {
    qVar4 = QByteArrayView::indexOf(&local_138,'|',0);
    if (qVar4 != -1) {
      psVar2 = local_138.m_data;
      if (qVar4 == 0) {
        parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
        super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size._0_4_ = 2;
        parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
        super__Optional_payload_base<QByteArrayView>._20_4_ = 0;
        parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
        super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size._4_4_ = 0;
        parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
        super__Optional_payload_base<QByteArrayView>._M_payload._8_4_ = 0;
        parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
        super__Optional_payload_base<QByteArrayView>._M_payload._12_4_ = 0;
        parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
        super__Optional_payload_base<QByteArrayView>._M_engaged = false;
        parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
        super__Optional_payload_base<QByteArrayView>._17_3_ = 0;
        parsed.key.m_size = (qsizetype)anon_var_dwarf_1ca02;
        QMessageLogger::warning
                  ((QMessageLogger *)&parsed,
                   "QMetaEnum::keysToValue: malformed keys string, starts with \'|\', \"%s\"",
                   local_138.m_data);
      }
      else {
        if ((local_138.m_size == 0) ||
           (((undefined1 *)((long)local_138.m_data - 1))[local_138.m_size] != '|')) {
          pRVar8 = (R_conflict6 *)(local_138.m_size + (long)local_138.m_data);
          __return_storage_ptr__ = (_Storage<unsigned_long_long,_true>)local_138.m_data;
          while( true ) {
            parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
            super__Optional_payload_base<QByteArrayView>._M_payload._8_4_ =
                 (undefined4)__return_storage_ptr__._M_value;
            parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
            super__Optional_payload_base<QByteArrayView>._M_payload._12_4_ =
                 (undefined4)((ulong)__return_storage_ptr__ >> 0x20);
            if ((qVar4 == -1) || ((R_conflict6 *)__return_storage_ptr__._M_value == pRVar8)) break;
            parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
            super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size =
                 (qVar4 + (long)psVar2) - (long)__return_storage_ptr__;
            QVarLengthArray<QByteArrayView,_10LL>::emplace_back<QByteArrayView>
                      ((QVarLengthArray<QByteArrayView,_10LL> *)local_f0,(QByteArrayView *)&parsed);
            if (((undefined1 *)((long)psVar2 + 1))[qVar4] == '|') {
              parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
              super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size._0_4_ = 2;
              parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
              super__Optional_payload_base<QByteArrayView>._20_4_ = 0;
              parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
              super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size._4_4_ = 0;
              parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
              super__Optional_payload_base<QByteArrayView>._M_payload._8_4_ = 0;
              parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
              super__Optional_payload_base<QByteArrayView>._M_payload._12_4_ = 0;
              parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
              super__Optional_payload_base<QByteArrayView>._M_engaged = false;
              parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
              super__Optional_payload_base<QByteArrayView>._17_3_ = 0;
              parsed.key.m_size = (qsizetype)anon_var_dwarf_1ca02;
              QMessageLogger::warning
                        ((QMessageLogger *)&parsed,
                         "QMetaEnum::keysToValue: malformed keys string, has two consecutive \'|\': \"%s\""
                         ,local_138.m_data);
              goto LAB_00262f04;
            }
            __return_storage_ptr__._M_value = qVar4 + (long)psVar2 + 1;
            qVar4 = QByteArrayView::indexOf(&local_138,'|',qVar4 + 1);
          }
          parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
          super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size =
               (long)pRVar8 - (long)__return_storage_ptr__;
          QVarLengthArray<QByteArrayView,_10LL>::emplace_back<QByteArrayView>
                    ((QVarLengthArray<QByteArrayView,_10LL> *)local_f0,(QByteArrayView *)&parsed);
          goto LAB_0026302e;
        }
        parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
        super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size._0_4_ = 2;
        parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
        super__Optional_payload_base<QByteArrayView>._20_4_ = 0;
        parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
        super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size._4_4_ = 0;
        parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
        super__Optional_payload_base<QByteArrayView>._M_payload._8_4_ = 0;
        parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
        super__Optional_payload_base<QByteArrayView>._M_payload._12_4_ = 0;
        parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
        super__Optional_payload_base<QByteArrayView>._M_engaged = false;
        parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
        super__Optional_payload_base<QByteArrayView>._17_3_ = 0;
        parsed.key.m_size = (qsizetype)anon_var_dwarf_1ca02;
        QMessageLogger::warning
                  ((QMessageLogger *)&parsed,
                   "QMetaEnum::keysToValue: malformed keys string, ends with \'|\', \"%s\"",
                   local_138.m_data);
      }
      goto LAB_00262f04;
    }
    QVarLengthArray<QByteArrayView,_10LL>::append
              ((QVarLengthArray<QByteArrayView,_10LL> *)local_f0,&local_138);
LAB_0026302e:
    pQVar9 = (QByteArrayView *)(local_f0._16_8_ + local_f0._8_8_ * 0x10);
    local_178._M_value = 0;
    __return_storage_ptr__._M_value = (unsigned_long_long)&parsed;
    for (this_00 = (QByteArrayView *)local_f0._16_8_; this_00 != pQVar9; this_00 = this_00 + 1) {
      parsed.key.m_data = &DAT_aaaaaaaaaaaaaaaa;
      parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
      super__Optional_payload_base<QByteArrayView>._M_engaged = true;
      parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
      super__Optional_payload_base<QByteArrayView>._17_3_ = 0xaaaaaa;
      parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
      super__Optional_payload_base<QByteArrayView>._20_4_ = 0xaaaaaaaa;
      parsed.key.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
      super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size._0_4_ = 0xaaaaaaaa;
      parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
      super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size._4_4_ = 0xaaaaaaaa;
      parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
      super__Optional_payload_base<QByteArrayView>._M_payload._8_4_ = 0xaaaaaaaa;
      parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
      super__Optional_payload_base<QByteArrayView>._M_payload._12_4_ = 0xaaaaaaaa;
      qualifiedKey = QByteArrayView::trimmed(this_00);
      parse_scope((R_conflict6 *)__return_storage_ptr__,qualifiedKey);
      if (parsed.scope.super__Optional_base<QByteArrayView,_true,_true>._M_payload.
          super__Optional_payload_base<QByteArrayView>._M_engaged == true) {
        pQVar5 = std::
                 _Optional_base_impl<QByteArrayView,_std::_Optional_base<QByteArrayView,_true,_true>_>
                 ::_M_get((_Optional_base_impl<QByteArrayView,_std::_Optional_base<QByteArrayView,_true,_true>_>
                           *)__return_storage_ptr__);
        bVar3 = isScopeMatch(*pQVar5,this);
        if (!bVar3) goto LAB_00262f04;
      }
      local_128 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
      local_138.m_data = parsed.key.m_data;
      local_138.m_size = parsed.key.m_size;
      index = (this->data).d[3];
      iVar1 = index * 2;
      do {
        iVar1 = iVar1 + -2;
        if ((int)index < 1) goto LAB_00262f04;
        index = index - 1;
        local_148 = stringDataView(this->mobj,(this->mobj->d).data[(this->data).d[4] + iVar1]);
        bVar3 = ::comparesEqual(&local_138,&local_148);
      } while (!bVar3);
      local_128 = (undefined1 *)value_helper<EnumExtendMode>(this,index,modes);
      puStack_120 = (undefined1 *)CONCAT71(puStack_120._1_7_,1);
      puVar6 = std::
               _Optional_base_impl<unsigned_long_long,_std::_Optional_base<unsigned_long_long,_true,_true>_>
               ::_M_get((_Optional_base_impl<unsigned_long_long,_std::_Optional_base<unsigned_long_long,_true,_true>_>
                         *)&local_128);
      local_178._M_value = local_178._M_value | *puVar6;
    }
    uVar7 = CONCAT71((int7)((ulong)this_00 >> 8),1);
  }
  QVarLengthArray<QByteArrayView,_10LL>::~QVarLengthArray
            ((QVarLengthArray<QByteArrayView,_10LL> *)local_f0);
  unaff_R14 = local_178;
LAB_00262f13:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  oVar10.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._8_8_ = uVar7 & 0xffffffff;
  oVar10.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._M_payload._M_value = unaff_R14._M_value;
  return (optional<unsigned_long_long>)
         oVar10.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long_long>;
}

Assistant:

std::optional<quint64> QMetaEnum::keysToValue64(const char *keys) const
{
    if (!mobj || !keys)
        return std::nullopt;

    EnumExtendMode mode = enumExtendMode(*this);
    auto lookup = [&] (QByteArrayView key) -> std::optional<quint64> {
        for (int i = data.keyCount() - 1; i >= 0; --i) {
            if (key == stringDataView(mobj, mobj->d.data[data.data() + 2*i]))
                return value_helper(i, mode);
        }
        return std::nullopt;
    };

    quint64 value = 0;
    QVarLengthArray<QByteArrayView, 10> list;
    const bool r = parseEnumFlags(QByteArrayView{keys}, list);
    if (!r)
        return std::nullopt;
    for (const auto &untrimmed : list) {
        const auto parsed = parse_scope(untrimmed.trimmed());
        if (parsed.scope && !isScopeMatch(*parsed.scope, this))
            return std::nullopt; // wrong type name in qualified name
        if (auto thisValue = lookup(parsed.key))
            value |= *thisValue;
        else
            return std::nullopt; // no such enumerator
    }
    return value;
}